

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::scriptDisplayName
          (LocaleDisplayNamesImpl *this,char *script,UnicodeString *result,UBool skipAdjust)

{
  if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
    ICUDataTable::get(&this->langData,"Scripts%short",script,result);
    if ((undefined1  [56])((undefined1  [56])result->fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) goto LAB_0027cd02;
  }
  ICUDataTable::get(&this->langData,"Scripts",script,result);
LAB_0027cd02:
  if (skipAdjust == '\0') {
    adjustForUsageAndContext(this,kCapContextUsageScript,result);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::scriptDisplayName(const char* script,
                                          UnicodeString& result,
                                          UBool skipAdjust) const {
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Scripts%short", script, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageScript, result);
        }
    }
    langData.get("Scripts", script, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageScript, result);
}